

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O3

bool __thiscall QUndoStack::isActive(QUndoStack *this)

{
  QUndoGroup *this_00;
  QUndoStack *pQVar1;
  bool bVar2;
  
  this_00 = *(QUndoGroup **)(*(long *)&this->field_0x8 + 0xb0);
  if (this_00 == (QUndoGroup *)0x0) {
    bVar2 = true;
  }
  else {
    pQVar1 = QUndoGroup::activeStack(this_00);
    bVar2 = pQVar1 == this;
  }
  return bVar2;
}

Assistant:

bool QUndoStack::isActive() const
{
#if !QT_CONFIG(undogroup)
    return true;
#else
    Q_D(const QUndoStack);
    return d->group == nullptr || d->group->activeStack() == this;
#endif
}